

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O3

void __thiscall
cfd::core::ElementsConfidentialAddress::CalculateAddress
          (ElementsConfidentialAddress *this,Address *unblinded_address,
          ConfidentialKey *confidential_key)

{
  char *pcVar1;
  _Base_ptr *pp_Var2;
  string *psVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  uint32_t uVar6;
  CfdException *pCVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *wally_string;
  string *key;
  int ret;
  char *output;
  AddressFormatData data;
  string hrp;
  string address;
  int local_144 [5];
  undefined1 local_130 [32];
  WallyUtil *local_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  CfdSourceLocation local_d8;
  string local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  string *local_78;
  Address *local_70;
  pointer local_68;
  vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
  local_60 [2];
  
  bVar5 = Pubkey::IsValid(confidential_key);
  if (!bVar5) {
    local_d8.filename = "cfdcore_elements_address.cpp";
    local_d8.line = 0xf0;
    local_d8.funcname = "CalculateAddress";
    Pubkey::GetHex_abi_cxx11_((string *)&local_108,confidential_key);
    Pubkey::GetData((ByteData *)&local_b8,confidential_key);
    local_130._0_8_ = ByteData::GetDataSize((ByteData *)&local_b8);
    logger::log<std::__cxx11::string&,unsigned_long&>
              (&local_d8,kCfdLogLevelWarning,
               "CalculateAddress error. Confidential key is invalid. : confidential_key={}, size={}."
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
               (unsigned_long *)local_130);
    if (local_b8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    pp_Var2 = &local_108._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((_Base_ptr *)local_108._M_impl._0_8_ != pp_Var2) {
      operator_delete((void *)local_108._M_impl._0_8_);
    }
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_108._M_impl._0_8_ = pp_Var2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CalculateAddress error. Confidential key is invalid.","");
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_108);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar5 = Pubkey::IsCompress(confidential_key);
  if (!bVar5) {
    local_d8.filename = "cfdcore_elements_address.cpp";
    local_d8.line = 0xfb;
    local_d8.funcname = "CalculateAddress";
    Pubkey::GetHex_abi_cxx11_((string *)&local_108,confidential_key);
    Pubkey::GetData((ByteData *)&local_b8,confidential_key);
    local_130._0_8_ = ByteData::GetDataSize((ByteData *)&local_b8);
    logger::log<std::__cxx11::string&,unsigned_long&>
              (&local_d8,kCfdLogLevelWarning,
               "CalculateAddress error. Confidential key is not compressed. : confidential_key={}, size={}."
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
               (unsigned_long *)local_130);
    if (local_b8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    pp_Var2 = &local_108._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((_Base_ptr *)local_108._M_impl._0_8_ != pp_Var2) {
      operator_delete((void *)local_108._M_impl._0_8_);
    }
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_108._M_impl._0_8_ = pp_Var2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CalculateAddress error. Confidential key is not compressed.",""
              );
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_108);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  Pubkey::GetData((ByteData *)&local_108,confidential_key);
  ByteData::GetBytes(&local_98,(ByteData *)&local_108);
  if ((pointer)local_108._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._M_impl._0_8_);
  }
  local_110 = (WallyUtil *)0x0;
  local_144[0] = -1;
  local_d8.filename = (char *)&local_d8.funcname;
  local_d8.line = 0;
  local_d8._12_4_ = 0;
  local_d8.funcname = (char *)((ulong)local_d8.funcname & 0xffffffffffffff00);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_108,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&unblinded_address->format_data_);
  core::Address::GetAddress_abi_cxx11_(&local_b8,unblinded_address);
  local_70 = unblinded_address;
  GetBlindKeyPair();
  local_68 = local_60[0].
             super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_60[0].
      super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60[0].
      super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = local_130 + 0x10;
    local_78 = (string *)&this->address_;
    local_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->confidential_key_;
    key = &(local_60[0].
            super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
            ._M_impl.super__Vector_impl_data._M_start)->blinded_prefix_key;
    do {
      local_110 = (WallyUtil *)0x0;
      if (*(char *)&key[1]._M_dataplus._M_p == '\x01') {
        AddressFormatData::GetString((string *)local_130,(AddressFormatData *)&local_108,key);
        ::std::__cxx11::string::operator=((string *)&local_d8,(string *)local_130);
        if ((char *)local_130._0_8_ != pcVar1) {
          operator_delete((void *)local_130._0_8_);
        }
        _Var4._M_p = local_b8._M_dataplus._M_p;
        AddressFormatData::GetString((string *)local_130,(AddressFormatData *)&local_108,key + -1);
        local_144[0] = wally_confidential_addr_from_addr_segwit
                                 (_Var4._M_p,local_130._0_8_,local_d8.filename,
                                  local_98.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_98.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_98.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,&local_110);
        wally_string = extraout_RDX;
        if ((char *)local_130._0_8_ != pcVar1) {
          operator_delete((void *)local_130._0_8_);
          wally_string = extraout_RDX_00;
        }
        if (local_144[0] != 0) {
          local_130._0_8_ = "cfdcore_elements_address.cpp";
          local_130._8_4_ = 0x118;
          local_130._16_8_ = "CalculateAddress";
          logger::log<int&>((CfdSourceLocation *)local_130,kCfdLogLevelTrace,"fail libwally. ret={}"
                            ,local_144);
          wally_string = extraout_RDX_01;
        }
      }
      else {
        uVar6 = AddressFormatData::GetValue((AddressFormatData *)&local_108,key);
        local_144[0] = wally_confidential_addr_from_addr
                                 (local_b8._M_dataplus._M_p,uVar6,
                                  local_98.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_98.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_98.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,&local_110);
        wally_string = extraout_RDX_02;
        if (local_144[0] == 0) goto LAB_001dd51a;
        local_130._0_8_ = "cfdcore_elements_address.cpp";
        local_130._8_4_ = 0x120;
        local_130._16_8_ = "CalculateAddress";
        logger::log<int&>((CfdSourceLocation *)local_130,kCfdLogLevelTrace,"fail libwally. ret={}",
                          local_144);
        wally_string = extraout_RDX_03;
      }
      if (local_144[0] == 0) {
LAB_001dd51a:
        WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)local_130,local_110,wally_string);
        ::std::__cxx11::string::operator=(local_78,(string *)local_130);
        if ((char *)local_130._0_8_ != pcVar1) {
          operator_delete((void *)local_130._0_8_);
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (local_80,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            confidential_key);
        core::Address::operator=(&this->unblinded_address_,local_70);
        ::std::
        vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
        ::~vector(local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_108);
        if ((char **)local_d8.filename != &local_d8.funcname) {
          operator_delete(local_d8.filename);
        }
        if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
      psVar3 = key + 1;
      key = (string *)&key[2]._M_string_length;
    } while ((pointer)&psVar3->_M_string_length != local_68);
  }
  ::std::
  vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
  ::~vector(local_60);
  local_130._0_8_ = "cfdcore_elements_address.cpp";
  local_130._8_4_ = 0x133;
  local_130._16_8_ = "CalculateAddress";
  logger::log<std::__cxx11::string&>
            ((CfdSourceLocation *)local_130,kCfdLogLevelWarning,
             "CalculateAddress error. Address prefix not found. : address={}.",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8);
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  local_130._0_8_ = local_130 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,"CalculateAddress address prefix not found.","");
  CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_130);
  __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ElementsConfidentialAddress::CalculateAddress(
    const Address& unblinded_address,
    const ConfidentialKey& confidential_key) {
  if (!confidential_key.IsValid()) {
    warn(
        CFD_LOG_SOURCE,
        "CalculateAddress error. Confidential key is invalid."
        " : confidential_key={}, size={}.",
        confidential_key.GetHex(), confidential_key.GetData().GetDataSize());
    throw CfdException(
        kCfdIllegalArgumentError,
        "CalculateAddress error. Confidential key is invalid.");
  }
  // 33bytes: ConfidentialKey
  if (!confidential_key.IsCompress()) {
    warn(
        CFD_LOG_SOURCE,
        "CalculateAddress error. Confidential key is not compressed."
        " : confidential_key={}, size={}.",
        confidential_key.GetHex(), confidential_key.GetData().GetDataSize());
    throw CfdException(
        kCfdIllegalArgumentError,
        "CalculateAddress error. Confidential key is not compressed.");
  }

  const std::vector<uint8_t>& pubkey_data =
      confidential_key.GetData().GetBytes();
  char* output = nullptr;

  int ret = -1;
  uint32_t prefix;
  std::string hrp;
  AddressFormatData data = unblinded_address.GetAddressFormatData();
  std::string address = unblinded_address.GetAddress();
  for (const auto& format : GetBlindKeyPair()) {
    try {
      output = nullptr;

      // Get confidential_key
      if (format.is_segwit) {
        hrp = data.GetString(format.blinded_prefix_key);
        ret = wally_confidential_addr_from_addr_segwit(
            address.c_str(), data.GetString(format.prefix_key).c_str(),
            hrp.c_str(), pubkey_data.data(), pubkey_data.size(), &output);
        if (ret != WALLY_OK) {
          trace(CFD_LOG_SOURCE, "fail libwally. ret={}", ret);
        }
      } else {
        prefix = data.GetValue(format.blinded_prefix_key);
        ret = wally_confidential_addr_from_addr(
            address.c_str(), prefix, pubkey_data.data(), pubkey_data.size(),
            &output);
        if (ret != WALLY_OK) {
          trace(CFD_LOG_SOURCE, "fail libwally. ret={}", ret);
        }
      }

      if (ret == WALLY_OK) {
        address_ = WallyUtil::ConvertStringAndFree(output);
        confidential_key_ = confidential_key;
        unblinded_address_ = unblinded_address;
        return;
      }
    } catch (const CfdException& except) {
      // Ignore
      trace(
          CFD_LOG_SOURCE, "CalculateAddress exception={}",
          std::string(except.what()));
    }
  }

  warn(
      CFD_LOG_SOURCE,
      "CalculateAddress error. Address prefix not found."
      " : address={}.",
      address);
  throw CfdException(
      kCfdIllegalArgumentError, "CalculateAddress address prefix not found.");
}